

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O2

void __thiscall Graph::addEdge(Graph *this,int i,int j)

{
  reference rVar1;
  
  if ((((-1 < i) && (j < this->r)) && (0 < j)) && (i < this->r)) {
    rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((this->adjMatrix).
                       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (uint)i,(ulong)(uint)j);
    *rVar1._M_p = *rVar1._M_p | rVar1._M_mask;
    rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((this->adjMatrix).
                       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (uint)j,(ulong)(uint)i);
    *rVar1._M_p = *rVar1._M_p | rVar1._M_mask;
    return;
  }
  __assert_fail("i >= 0 && i < r && j > 0 && j < r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/leannejdong[P]circuitdebug/algorithm.cpp"
                ,0x26,"void Graph::addEdge(int, int)");
}

Assistant:

void addEdge(int i, int j) {
        assert(i >= 0 && i < r && j > 0 && j < r);
        adjMatrix[i][j] = true;
        adjMatrix[j][i] = true;
    }